

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O1

void SplitRGBPlane(uint8_t *src_rgb,int src_stride_rgb,uint8_t *dst_r,int dst_stride_r,
                  uint8_t *dst_g,int dst_stride_g,uint8_t *dst_b,int dst_stride_b,int width,
                  int height)

{
  int iVar1;
  uint uVar2;
  code *pcVar3;
  
  iVar1 = height;
  if (height < 0) {
    iVar1 = -height;
    uVar2 = ~height;
    dst_r = dst_r + (int)(uVar2 * dst_stride_r);
    dst_g = dst_g + (int)(uVar2 * dst_stride_g);
    dst_b = dst_b + (int)(uVar2 * dst_stride_b);
    dst_stride_r = -dst_stride_r;
    dst_stride_g = -dst_stride_g;
    dst_stride_b = -dst_stride_b;
  }
  if (dst_stride_b == width &&
      ((dst_stride_g == width && dst_stride_r == width) && width * 3 == src_stride_rgb)) {
    width = iVar1 * width;
    src_stride_rgb = 0;
    dst_stride_r = 0;
    dst_stride_g = 0;
    dst_stride_b = 0;
    iVar1 = 1;
  }
  uVar2 = cpu_info_;
  if (cpu_info_ == 0) {
    uVar2 = InitCpuFlags();
  }
  if ((width & 0xfU) == 0) {
    pcVar3 = SplitRGBRow_SSSE3;
  }
  else {
    pcVar3 = SplitRGBRow_Any_SSSE3;
  }
  if ((uVar2 & 0x40) == 0) {
    pcVar3 = SplitRGBRow_C;
  }
  if (0 < iVar1) {
    do {
      (*pcVar3)(src_rgb,dst_r,dst_g,dst_b,width);
      dst_r = dst_r + dst_stride_r;
      dst_g = dst_g + dst_stride_g;
      dst_b = dst_b + dst_stride_b;
      src_rgb = src_rgb + src_stride_rgb;
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
  }
  return;
}

Assistant:

LIBYUV_API
void SplitRGBPlane(const uint8_t* src_rgb,
                   int src_stride_rgb,
                   uint8_t* dst_r,
                   int dst_stride_r,
                   uint8_t* dst_g,
                   int dst_stride_g,
                   uint8_t* dst_b,
                   int dst_stride_b,
                   int width,
                   int height) {
  int y;
  void (*SplitRGBRow)(const uint8_t* src_rgb, uint8_t* dst_r, uint8_t* dst_g,
                      uint8_t* dst_b, int width) = SplitRGBRow_C;
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    dst_r = dst_r + (height - 1) * dst_stride_r;
    dst_g = dst_g + (height - 1) * dst_stride_g;
    dst_b = dst_b + (height - 1) * dst_stride_b;
    dst_stride_r = -dst_stride_r;
    dst_stride_g = -dst_stride_g;
    dst_stride_b = -dst_stride_b;
  }
  // Coalesce rows.
  if (src_stride_rgb == width * 3 && dst_stride_r == width &&
      dst_stride_g == width && dst_stride_b == width) {
    width *= height;
    height = 1;
    src_stride_rgb = dst_stride_r = dst_stride_g = dst_stride_b = 0;
  }
#if defined(HAS_SPLITRGBROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    SplitRGBRow = SplitRGBRow_Any_SSSE3;
    if (IS_ALIGNED(width, 16)) {
      SplitRGBRow = SplitRGBRow_SSSE3;
    }
  }
#endif
#if defined(HAS_SPLITRGBROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    SplitRGBRow = SplitRGBRow_Any_MMI;
    if (IS_ALIGNED(width, 4)) {
      SplitRGBRow = SplitRGBRow_MMI;
    }
  }
#endif
#if defined(HAS_SPLITRGBROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    SplitRGBRow = SplitRGBRow_Any_NEON;
    if (IS_ALIGNED(width, 16)) {
      SplitRGBRow = SplitRGBRow_NEON;
    }
  }
#endif

  for (y = 0; y < height; ++y) {
    // Copy a row of RGB.
    SplitRGBRow(src_rgb, dst_r, dst_g, dst_b, width);
    dst_r += dst_stride_r;
    dst_g += dst_stride_g;
    dst_b += dst_stride_b;
    src_rgb += src_stride_rgb;
  }
}